

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# joypad.c
# Opt level: O0

void joypad_delete(JoypadBuffer *buffer)

{
  JoypadChunk *pJVar1;
  JoypadChunk *next;
  JoypadChunk *current;
  JoypadBuffer *buffer_local;
  
  if (buffer != (JoypadBuffer *)0x0) {
    next = (buffer->sentinel).next;
    while ((JoypadBuffer *)next != buffer) {
      pJVar1 = next->next;
      free(next->data);
      free(next);
      next = pJVar1;
    }
    free(buffer);
  }
  return;
}

Assistant:

void joypad_delete(JoypadBuffer* buffer) {
  if (!buffer) {
    return;
  }
  JoypadChunk* current = buffer->sentinel.next;
  while (current != &buffer->sentinel) {
    JoypadChunk* next = current->next;
    xfree(current->data);
    xfree(current);
    current = next;
  }
  xfree(buffer);
}